

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

sexp_conflict
sexp_set_socket_option_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2,sexp_conflict arg3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  sexp_conflict res;
  int tmp3;
  int err;
  int local_90;
  int local_88;
  int local_78;
  int local_70;
  int local_60;
  int local_58;
  int local_50;
  sexp_conflict local_48;
  int local_40 [14];
  sexp_conflict local_8;
  
  local_40[1] = 0;
  if (((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) || (((ulong)in_RCX & 1) == 1)) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if ((((ulong)in_R9 & 1) == 1) || ((((ulong)in_R9 & 3) == 0 && (*in_R9 == 0xc)))) {
        if ((((ulong)in_stack_00000008 & 1) == 1) ||
           ((((ulong)in_stack_00000008 & 3) == 0 && (*in_stack_00000008 == 0xc)))) {
          if (((ulong)in_stack_00000008 & 1) == 1) {
            auVar1._8_8_ = (long)in_stack_00000008 >> 0x3f;
            auVar1._0_8_ = (ulong)in_stack_00000008 & 0xfffffffffffffffe;
            local_50 = SUB164(auVar1 / SEXT816(2),0);
          }
          else {
            if ((((ulong)in_stack_00000008 & 3) == 0) && (*in_stack_00000008 == 0xc)) {
              local_58 = (int)(char)in_stack_00000008[2] *
                         (int)*(undefined8 *)(in_stack_00000008 + 6);
            }
            else {
              local_58 = 0;
            }
            local_50 = local_58;
          }
          local_40[0] = local_50;
          if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) {
            local_60 = (int)*(undefined8 *)(in_RCX + 4);
          }
          else {
            auVar2._8_8_ = (long)in_RCX >> 0x3f;
            auVar2._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
            local_60 = SUB164(auVar2 / SEXT816(2),0);
          }
          if (((ulong)in_R8 & 1) == 1) {
            auVar3._8_8_ = (long)in_R8 >> 0x3f;
            auVar3._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
            local_70 = SUB164(auVar3 / SEXT816(2),0);
          }
          else {
            if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
              local_78 = (int)(char)in_R8[2] * (int)*(undefined8 *)(in_R8 + 6);
            }
            else {
              local_78 = 0;
            }
            local_70 = local_78;
          }
          if (((ulong)in_R9 & 1) == 1) {
            auVar4._8_8_ = (long)in_R9 >> 0x3f;
            auVar4._0_8_ = (ulong)in_R9 & 0xfffffffffffffffe;
            local_88 = SUB164(auVar4 / SEXT816(2),0);
          }
          else {
            if ((((ulong)in_R9 & 3) == 0) && (*in_R9 == 0xc)) {
              local_90 = (int)(char)in_R9[2] * (int)*(undefined8 *)(in_R9 + 6);
            }
            else {
              local_90 = 0;
            }
            local_88 = local_90;
          }
          iVar5 = setsockopt(local_60,local_70,local_88,local_40,4);
          if (iVar5 == 0) {
            local_48 = (sexp_conflict)0x13e;
          }
          else {
            local_48 = (sexp_conflict)0x3e;
          }
          local_8 = local_48;
        }
        else {
          local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_stack_00000008);
        }
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R9);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x12,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_set_socket_option_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2, sexp arg3) {
  int err = 0;
  int tmp3;
  sexp res;
  if (! (sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (! sexp_exact_integerp(arg3))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg3);
  tmp3 = sexp_sint_value(arg3);
  err = setsockopt((sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), sexp_sint_value(arg1), sexp_sint_value(arg2), &tmp3, sizeof(int));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}